

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

QStringList * __thiscall
QDir::entryList(QStringList *__return_storage_ptr__,QDir *this,QStringList *nameFilters,
               Filters filters,SortFlags sort)

{
  QDirPrivate *this_00;
  compare_eq_result_container<QList<QString>,_QString> cVar1;
  long in_FS_OFFSET;
  QDirListing dirList;
  QFileInfo local_68;
  DirEntry local_60;
  QArrayDataPointer<QFileInfo> local_58;
  QDirListing local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d.ptr;
  if ((QFlagsStorage<QDir::Filter>)
      filters.super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i ==
      (QFlagsStorage<QDir::Filter>)0xffffffff) {
    filters.super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorageHelper<QDir::Filter,_4>)
         (this_00->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
         super_QFlagsStorage<QDir::Filter>.i;
  }
  if ((QFlagsStorage<QDir::SortFlag>)
      sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i ==
      (QFlagsStorage<QDir::SortFlag>)0xffffffff) {
    sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i =
         (QFlagsStorageHelper<QDir::SortFlag,_4>)
         (this_00->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
         super_QFlagsStorage<QDir::SortFlag>.i;
  }
  if ((((filters.super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i ==
         (QFlagsStorageHelper<QDir::Filter,_4>)
         (this_00->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
         super_QFlagsStorage<QDir::Filter>.i) &&
       (sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i ==
        (QFlagsStorageHelper<QDir::SortFlag,_4>)
        (this_00->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
        super_QFlagsStorage<QDir::SortFlag>.i)) &&
      (cVar1 = QList<QString>::operator==(nameFilters,&this_00->nameFilters), cVar1)) &&
     ((((uint)sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.
              i & 3) != 3 || (((this_00->fileCache).fileListsInitialized._M_base._M_i & 1U) != 0))))
  {
    QDirPrivate::initFileLists(this_00,this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QArrayDataPointer<QString>::QArrayDataPointer
                (&__return_storage_ptr__->d,&(this_00->fileCache).files.d);
      return __return_storage_ptr__;
    }
  }
  else {
    local_40.d = (QDirListingPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::filePath((QString *)&local_58,&this_00->dirEntry);
    QDirListing::QDirListing
              (&local_40,(QString *)&local_58,nameFilters,
               (uint)filters.super_QFlagsStorageHelper<QDir::Filter,_4>.
                     super_QFlagsStorage<QDir::Filter>.i,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    if (((uint)sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>
               .i & 3) == 3) {
      local_60.dirListPtr = (QDirListingPrivate *)QDirListing::begin(&local_40);
      for (; local_60.dirListPtr != (QDirListingPrivate *)0x0;
          local_60 = QDirListing::next(local_60)) {
        QDirListing::DirEntry::fileName((QString *)&local_58,&local_60);
        QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      }
    }
    else {
      local_58.d = (Data *)0x0;
      local_58.ptr = (QFileInfo *)0x0;
      local_58.size = 0;
      local_60.dirListPtr = (QDirListingPrivate *)QDirListing::begin(&local_40);
      for (; local_60.dirListPtr != (QDirListingPrivate *)0x0;
          local_60 = QDirListing::next(local_60)) {
        QDirListing::DirEntry::fileInfo((DirEntry *)&local_68);
        QList<QFileInfo>::emplaceBack<QFileInfo>((QList<QFileInfo> *)&local_58,&local_68);
        QFileInfo::~QFileInfo(&local_68);
      }
      QDirPrivate::sortFileList
                (sort,(QFileInfoList *)&local_58,__return_storage_ptr__,(QFileInfoList *)0x0);
      QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_58);
    }
    QDirListing::~QDirListing(&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QStringList QDir::entryList(const QStringList &nameFilters, Filters filters,
                            SortFlags sort) const
{
    Q_D(const QDir);

    if (filters == NoFilter)
        filters = d->filters;
    if (sort == NoSort)
        sort = d->sort;

    const bool needsSorting = (sort & QDir::SortByMask) != QDir::Unsorted;

    if (filters == d->filters && sort == d->sort && nameFilters == d->nameFilters) {
        // Don't fill a QFileInfo cache if we just need names
        if (needsSorting || d->fileCache.fileListsInitialized) {
            d->initFileLists(*this);
            return d->fileCache.files;
        }
    }

    QDirListing dirList(d->dirEntry.filePath(), nameFilters, filters.toInt());
    QStringList ret;
    if (needsSorting) {
        QFileInfoList l;
        for (const auto &dirEntry : dirList)
            l.emplace_back(dirEntry.fileInfo());
        d->sortFileList(sort, l, &ret, nullptr);
    } else {
        for (const auto &dirEntry : dirList)
            ret.emplace_back(dirEntry.fileName());
    }
    return ret;
}